

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbeMemClearExternAndSetNull(Mem *p)

{
  uint uVar1;
  
  uVar1._0_2_ = p->flags;
  uVar1._2_1_ = p->enc;
  uVar1._3_1_ = p->eSubtype;
  if ((uVar1 >> 0xd & 1) != 0) {
    sqlite3VdbeMemFinalize(p,(p->u).pDef);
    uVar1 = (uint)p->flags;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    (*p->xDel)(p->z);
  }
  p->flags = 1;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClearExternAndSetNull(Mem *p){
  assert( p->db==0 || sqlite3_mutex_held(p->db->mutex) );
  assert( VdbeMemDynamic(p) );
  if( p->flags&MEM_Agg ){
    sqlite3VdbeMemFinalize(p, p->u.pDef);
    assert( (p->flags & MEM_Agg)==0 );
    testcase( p->flags & MEM_Dyn );
  }
  if( p->flags&MEM_Dyn ){
    assert( p->xDel!=SQLITE_DYNAMIC && p->xDel!=0 );
    p->xDel((void *)p->z);
  }
  p->flags = MEM_Null;
}